

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O3

_Bool textui_get_rep_dir(int *dp,_Bool allow_5)

{
  byte bVar1;
  loc_conflict from;
  byte bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  loc_conflict to;
  ui_event uVar5;
  keypress ch;
  keypress ch_00;
  
  *dp = 0;
  do {
    event_signal(EVENT_MESSAGE_FLUSH);
    inkey_scan = 0xffffffff;
    uVar5 = inkey_ex();
    inkey_scan = 0;
    if ((uVar5.type == EVT_NONE) ||
       ((uVar5.type == EVT_KBRD &&
        (ch._8_4_ = uVar5._8_4_ & 0xff, ch._0_8_ = uVar5.mouse, wVar3 = target_dir_allow(ch,allow_5)
        , wVar3 == L'\0')))) {
      prt("Direction or <click> (Escape to cancel)? ",L'\0',L'\0');
      uVar5 = inkey_ex();
    }
    if (uVar5.type == EVT_MOUSE) {
      if (uVar5.key.code._2_1_ == '\x01') {
        from = player->grid;
        to = loc((int)((uVar5.key.code & 0xff) - col_map[Term->sidebar_mode]) /
                 (int)(uint)tile_width + Term->offset_x,
                 (int)((uVar5.key.code >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) /
                 (int)(uint)tile_height + Term->offset_y);
        wVar3 = pathfind_direction_to(from,to);
        goto LAB_001ebfa4;
      }
      if ((uVar5.key.code._2_2_ & 0xff) == 2) goto LAB_001ebfb3;
    }
    else if ((uVar5.type == EVT_KBRD) && ((ulong)uVar5.mouse >> 0x20 != 0)) {
      bVar2 = 1;
      wVar3 = L'\0';
      while( true ) {
        if (uVar5.key.code == 0xe000) goto LAB_001ebfb3;
        ch_00._8_4_ = uVar5._8_4_ & 0xff;
        ch_00._0_8_ = uVar5.mouse;
        wVar4 = target_dir_allow(ch_00,allow_5);
        if (wVar4 != L'\0') {
          wVar3 = dir_transitions[wVar3][wVar4];
        }
        bVar1 = (player->opts).lazymove_delay;
        if ((bool)(~bVar2 & 1 | bVar1 == 0)) break;
        inkey_scan = (uint32_t)bVar1;
        uVar5 = inkey_ex();
        if (((ulong)uVar5.mouse >> 0x20 == 0) || (bVar2 = 0, uVar5.type != EVT_KBRD)) break;
      }
      if (wVar3 == L'\x05' && !allow_5) {
LAB_001ebfb3:
        prt("",L'\0',L'\0');
        return false;
      }
LAB_001ebfa4:
      if (wVar3 != L'\0') {
        prt("",L'\0',L'\0');
        *dp = wVar3;
        return true;
      }
    }
    bell();
  } while( true );
}

Assistant:

static bool textui_get_rep_dir(int *dp, bool allow_5)
{
	int dir = 0;

	ui_event ke;

	/* Initialize */
	(*dp) = 0;

	/* Get a direction */
	while (!dir) {
		/* Paranoia*/
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Get first keypress - the first test is to avoid displaying the
		 * prompt for direction if there's already a keypress queued up
		 * and waiting - this just avoids a flickering prompt if there is
		 * a "lazy" movement delay. */
		inkey_scan = SCAN_INSTANT;
		ke = inkey_ex();
		inkey_scan = SCAN_OFF;

		if (ke.type == EVT_NONE ||
				(ke.type == EVT_KBRD
				&& !target_dir_allow(ke.key, allow_5))) {
			prt("Direction or <click> (Escape to cancel)? ", 0, 0);
			ke = inkey_ex();
		}

		/* Check mouse coordinates, or get keypresses until a dir is chosen */
		if (ke.type == EVT_MOUSE) {
			if (ke.mouse.button == 1) {
				int y = KEY_GRID_Y(ke);
				int x = KEY_GRID_X(ke);
				struct loc from = player->grid;
				struct loc to = loc(x, y);

				dir = pathfind_direction_to(from, to);
			} else if (ke.mouse.button == 2) {
				/* Clear the prompt */
				prt("", 0, 0);

				return (false);
			}
		} else if (ke.type == EVT_KBRD) {
			int keypresses_handled = 0;

			while (ke.type == EVT_KBRD && ke.key.code != 0) {
				int this_dir;

				if (ke.key.code == ESCAPE) {
					/* Clear the prompt */
					prt("", 0, 0);

					return (false);
				}

				/* XXX Ideally show and move the cursor here to indicate
				 the currently "Pending" direction. XXX */
				this_dir = target_dir_allow(ke.key, allow_5);

				if (this_dir)
					dir = dir_transitions[dir][this_dir];

				if (player->opts.lazymove_delay == 0 || ++keypresses_handled > 1)
					break;

				inkey_scan = player->opts.lazymove_delay;
				ke = inkey_ex();
			}

			/* 5 is equivalent to "escape" */
			if (dir == 5 && !allow_5) {
				/* Clear the prompt */
				prt("", 0, 0);

				return (false);
			}
		}

		/* Oops */
		if (!dir) bell();
	}

	/* Clear the prompt */
	prt("", 0, 0);

	/* Save direction */
	(*dp) = dir;

	/* Success */
	return (true);
}